

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O3

char * buffer_flatten(Buffer *buffer)

{
  BufferBlock *pBVar1;
  BufferBlock *pBVar2;
  char *pcVar3;
  char *__dest;
  
  pcVar3 = (char *)(*buffer->m)((int)buffer->total_bytes + 1,buffer->d);
  if (pcVar3 != (char *)0x0) {
    pBVar2 = buffer->head;
    __dest = pcVar3;
    while (pBVar2 != (BufferBlock *)0x0) {
      pBVar1 = pBVar2->next;
      memcpy(__dest,pBVar2->data,pBVar2->bytes);
      __dest = __dest + pBVar2->bytes;
      (*buffer->f)(pBVar2,buffer->d);
      pBVar2 = pBVar1;
    }
    *__dest = '\0';
    if (__dest != pcVar3 + buffer->total_bytes) {
      __assert_fail("ptr == (retval + buffer->total_bytes)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                    ,0x365,"char *buffer_flatten(Buffer *)");
    }
    buffer->total_bytes = 0;
    buffer->head = (BufferBlock *)0x0;
    buffer->tail = (BufferBlock *)0x0;
  }
  return pcVar3;
}

Assistant:

char *buffer_flatten(Buffer *buffer)
{
    char *retval = (char *) buffer->m(buffer->total_bytes + 1, buffer->d);
    if (retval == NULL)
        return NULL;
    BufferBlock *item = buffer->head;
    char *ptr = retval;
    while (item != NULL)
    {
        BufferBlock *next = item->next;
        memcpy(ptr, item->data, item->bytes);
        ptr += item->bytes;
        buffer->f(item, buffer->d);
        item = next;
    } // while
    *ptr = '\0';

    assert(ptr == (retval + buffer->total_bytes));

    buffer->head = buffer->tail = NULL;
    buffer->total_bytes = 0;

    return retval;
}